

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O3

void write_velocity(char *fn,qnode_ptr_t p)

{
  float fVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  param512_t *papVar6;
  int extraout_EDX;
  int iVar7;
  int *piVar8;
  qnode_ptr_t q;
  qnode_ptr_t q_00;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  float fVar15;
  float y;
  float x;
  int iStack_a4;
  float local_3c;
  float local_38;
  int local_34;
  
  q = (qnode_ptr_t)0x180;
  iVar2 = creat(fn,0x180);
  if (iVar2 < 1) {
    write_velocity_cold_1();
    q_00 = (qnode_ptr_t)(ulong)(uint)q->sizy;
    iVar2 = q->ofst;
    iVar10 = q->sizy - iVar2;
    if (iVar2 < iVar10) {
      iVar9 = q->sizx;
      iVar7 = iVar2;
      do {
        if (iVar2 < iVar9 - iVar2) {
          uVar5 = (ulong)(uint)q->sizz;
          iVar10 = iVar2;
          do {
            if (0 < (int)uVar5) {
              lVar13 = 0;
              do {
                fVar15 = dx((qnode_ptr_t)fn,q,iVar7,iVar10,(int)lVar13);
                (*q->param_ptr[lVar13])[q->res * iVar7 + iVar10].fx = fVar15;
                fVar15 = dy((qnode_ptr_t)fn,q,iVar7,iVar10,(int)lVar13);
                (*q->param_ptr[lVar13])[q->res * iVar7 + iVar10].fy = fVar15;
                lVar13 = lVar13 + 1;
                uVar5 = (ulong)q->sizz;
              } while (lVar13 < (long)uVar5);
              iVar9 = q->sizx;
              iVar2 = q->ofst;
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < iVar9 - iVar2);
          q_00 = (qnode_ptr_t)(ulong)(uint)q->sizy;
        }
        iVar7 = iVar7 + 1;
        iVar10 = (int)q_00 - iVar2;
      } while (iVar7 < iVar10);
    }
    iVar9 = (int)q_00;
    iVar7 = ((qnode_ptr_t)fn)->sizz / 2;
    if (iVar2 < iVar10) {
      iVar3 = q->sizx;
      iStack_a4 = iVar2;
      do {
        if (iVar2 < iVar3 - iVar2) {
          piVar8 = &(*q->param_ptr[iVar7])[(long)iStack_a4 * (long)q->res + (long)iVar2].err;
          iVar14 = iVar3 + iVar2 * -2;
          iVar12 = iVar2;
          do {
            if (*piVar8 == 0) {
              fVar15 = dt((qnode_ptr_t)fn,q_00,iStack_a4,iVar12);
              piVar8[-4] = (int)fVar15;
            }
            iVar12 = iVar12 + 1;
            piVar8 = piVar8 + 8;
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
        }
        iStack_a4 = iStack_a4 + 1;
      } while (iStack_a4 != iVar10);
    }
    iVar10 = iVar9 - iVar2;
    if ((extraout_EDX == 0) && (iVar2 < iVar10)) {
      iVar3 = q->sizx;
      iVar12 = iVar2;
      do {
        if (iVar2 < iVar3 - iVar2) {
          papVar6 = q->param_ptr[iVar7];
          iVar10 = q->res;
          lVar13 = (long)iVar2;
          do {
            if ((*papVar6)[iVar12 * iVar10 + lVar13].err == 0) {
              iVar2 = (int)lVar13;
              fVar15 = dxx(q,iVar12,iVar2,iVar7);
              (*q->param_ptr[iVar7])[(long)q->res * (long)iVar12 + lVar13].fxx = fVar15;
              fVar15 = dyy(q,iVar12,iVar2,iVar7);
              (*q->param_ptr[iVar7])[(long)q->res * (long)iVar12 + lVar13].fyy = fVar15;
              fVar15 = dxy(q,iVar12,iVar2,iVar7);
              papVar6 = q->param_ptr[iVar7];
              iVar10 = q->res;
              (*papVar6)[iVar12 * iVar10 + lVar13].fxy = fVar15;
              iVar3 = q->sizx;
              iVar2 = q->ofst;
            }
            lVar13 = lVar13 + 1;
          } while ((int)lVar13 < iVar3 - iVar2);
          iVar9 = q->sizy;
        }
        iVar12 = iVar12 + 1;
        iVar10 = iVar9 - iVar2;
      } while (iVar12 < iVar10);
    }
    if (iVar2 < iVar10) {
      lVar4 = (long)iVar2;
      lVar13 = q->sizx - lVar4;
      iVar9 = iVar2;
      do {
        if (iVar2 < (int)lVar13) {
          piVar8 = &(*q->param_ptr[iVar7])[(long)iVar9 * (long)q->res + lVar4].err;
          lVar11 = lVar4;
          do {
            if (*piVar8 == 0) {
              fVar15 = (float)*(undefined8 *)(piVar8 + -3);
              fVar1 = (float)((ulong)*(undefined8 *)(piVar8 + -3) >> 0x20);
              piVar8[-1] = (int)SQRT(fVar1 * fVar1 + fVar15 * fVar15);
            }
            lVar11 = lVar11 + 1;
            piVar8 = piVar8 + 8;
          } while (lVar11 < lVar13);
        }
        iVar9 = iVar9 + 1;
      } while (iVar9 != iVar10);
    }
    return;
  }
  local_38 = (float)p->sizx;
  local_3c = (float)p->sizy;
  write(iVar2,&local_38,4);
  write(iVar2,&local_3c,4);
  local_38 = (float)(p->sizx + KERNEL_X * -2 + -0x12);
  local_3c = (float)(p->sizy + KERNEL_Y * -2 + -0x12);
  write(iVar2,&local_38,4);
  write(iVar2,&local_3c,4);
  local_38 = (float)(KERNEL_X + 9);
  local_3c = (float)(KERNEL_Y + 9);
  write(iVar2,&local_38,4);
  write(iVar2,&local_3c,4);
  iVar10 = KERNEL_Y + 9;
  iVar9 = p->sizy;
  if (iVar10 < (iVar9 - KERNEL_Y) + -9) {
    iVar7 = p->sizx;
    iVar3 = KERNEL_Y;
    iVar12 = KERNEL_X;
    do {
      if (iVar12 + 9 < (iVar7 - iVar12) + -9) {
        lVar13 = (long)iVar12 + 9;
        local_34 = iVar10;
        do {
          lVar4 = (long)p->res * (long)iVar10 + lVar13;
          local_38 = (*p->flow_ptr)[lVar4].y;
          local_3c = -(*p->flow_ptr)[lVar4].x;
          write(iVar2,&local_38,4);
          write(iVar2,&local_3c,4);
          lVar13 = lVar13 + 1;
          iVar7 = p->sizx;
        } while ((int)lVar13 < (iVar7 - KERNEL_X) + -9);
        iVar9 = p->sizy;
        iVar3 = KERNEL_Y;
        iVar12 = KERNEL_X;
        iVar10 = local_34;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (iVar9 - iVar3) + -9);
  }
  close(iVar2);
  return;
}

Assistant:

void write_velocity(fn,p)
qnode_ptr_t p ;
char *fn ;

{ extern int KERNEL_X, KERNEL_Y ;
  float x, y ;
  int i, j, fdf, bytes ;

  if ((fdf=creat(fn,0600)) < 1) {
    error(6) ;
  }

  x = p->sizx ;
  y = p->sizy ;
  write(fdf,&x,4) ;
  write(fdf,&y,4) ;

  x = ((p->sizx-KERNEL_X-NRADIUS)-(KERNEL_X+NRADIUS)+SKIP-1)/SKIP ;
  y = ((p->sizy-KERNEL_Y-NRADIUS)-(KERNEL_Y+NRADIUS)+SKIP-1)/SKIP ;
  write(fdf,&x,4);
  write(fdf,&y,4);

  x = (KERNEL_X+NRADIUS+SKIP-1)/SKIP ;
  y = (KERNEL_Y+NRADIUS+SKIP-1)/SKIP ;
  write(fdf,&x,4) ;
  write(fdf,&y,4) ;
  bytes = 24 ;

  for(i = KERNEL_Y + NRADIUS ; i < p->sizy - KERNEL_Y - NRADIUS ; i++) {
    for(j = KERNEL_X + NRADIUS ; j < p->sizx - KERNEL_X - NRADIUS ; j++) {
      x = (*p->flow_ptr)[p->res*i + j].y ;
      y = -(*p->flow_ptr)[p->res*i + j].x ;
      write(fdf,&x,4) ;
      write(fdf,&y,4) ;
      bytes += 8 ;
    }
  }
  close(fdf) ;
}